

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool ts_parser__do_all_potential_reductions
                (TSParser *self,StackVersion starting_version,TSSymbol lookahead_symbol)

{
  byte bVar1;
  TSStateId state;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ReduceAction *pRVar7;
  TSParseAction *pTVar8;
  _Bool _Var9;
  byte bVar10;
  StackVersion v1;
  ReduceAction *pRVar11;
  ulong uVar12;
  _Bool _Var13;
  ushort uVar14;
  TSSymbol *pTVar15;
  TSSymbol symbol;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uint version2;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  TableEntry entry;
  TableEntry local_40;
  
  uVar4 = (self->stack->heads).size;
  uVar16 = 0;
  _Var13 = false;
  version2 = starting_version;
  do {
    uVar5 = (self->stack->heads).size;
    bVar24 = true;
    if (version2 < uVar5) {
      uVar18 = uVar4;
      if (uVar4 < version2) {
        do {
          _Var9 = ts_stack_merge(self->stack,uVar18,version2);
          if (_Var9) {
            bVar24 = false;
            goto LAB_0013901b;
          }
          uVar18 = uVar18 + 1;
        } while (version2 != uVar18);
      }
      if ((self->stack->heads).size <= version2) {
LAB_0013904f:
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
      }
      state = ((self->stack->heads).contents[version2].node)->state;
      (self->reduce_actions).size = 0;
      uVar14 = lookahead_symbol + 1;
      symbol = lookahead_symbol;
      if (lookahead_symbol == 0) {
        uVar14 = (ushort)self->language->token_count;
        symbol = 1;
      }
      bVar24 = false;
      if (symbol < uVar14) {
        do {
          ts_language_table_entry(self->language,state,symbol,&local_40);
          pTVar8 = local_40.actions;
          uVar21 = (ulong)local_40.action_count;
          if (uVar21 != 0) {
            uVar19 = 0;
            do {
              uVar2 = pTVar8[uVar19].params.field_1.dynamic_precedence;
              bVar10 = pTVar8[uVar19].field_0x6 & 0xf;
              bVar22 = bVar24;
              if (bVar10 == 3) {
LAB_00138dbb:
                bVar22 = true;
                if (((long)(short)uVar2 & 1U) != 0) {
                  bVar22 = bVar24;
                }
                if ((uVar2 & 2) != 0) {
                  bVar22 = bVar24;
                }
              }
              else if (bVar10 == 1) {
                bVar10 = pTVar8[uVar19].params.field_1.child_count;
                if ((ulong)bVar10 != 0) {
                  uVar3 = pTVar8[uVar19].params.field_0.state;
                  bVar1 = pTVar8[uVar19].params.field_1.alias_sequence_id;
                  uVar18 = (self->reduce_actions).size;
                  uVar12 = (ulong)uVar18;
                  if (uVar12 != 0) {
                    pTVar15 = &((self->reduce_actions).contents)->symbol;
                    bVar24 = true;
                    uVar20 = 1;
                    do {
                      if ((*pTVar15 == uVar3) &&
                         (((ReduceAction *)(pTVar15 + -2))->count == (uint)bVar10)) {
                        if (bVar24) goto LAB_00138f07;
                        break;
                      }
                      bVar24 = uVar20 < uVar12;
                      pTVar15 = pTVar15 + 8;
                      bVar23 = uVar20 != uVar12;
                      uVar20 = uVar20 + 1;
                    } while (bVar23);
                  }
                  uVar6 = (self->reduce_actions).capacity;
                  if (uVar18 == uVar6) {
                    uVar18 = uVar6 * 2;
                    if (uVar18 < 9) {
                      uVar18 = 8;
                    }
                    if (uVar6 < uVar18) {
                      pRVar11 = (self->reduce_actions).contents;
                      if (pRVar11 == (ReduceAction *)0x0) {
                        pRVar11 = (ReduceAction *)calloc((ulong)uVar18,0x10);
                        if (pRVar11 != (ReduceAction *)0x0) goto LAB_00138eb3;
                      }
                      else {
                        pRVar11 = (ReduceAction *)realloc(pRVar11,(ulong)uVar18 << 4);
                        if (pRVar11 != (ReduceAction *)0x0) {
LAB_00138eb3:
                          (self->reduce_actions).contents = pRVar11;
                          (self->reduce_actions).capacity = uVar18;
                          goto LAB_00138ed3;
                        }
                        ts_parser__do_all_potential_reductions_cold_1();
                      }
                      ts_parser__do_all_potential_reductions_cold_2();
                      goto LAB_0013904f;
                    }
                  }
LAB_00138ed3:
                  uVar20 = (ulong)uVar3 << 0x20 | (ulong)bVar10;
                  uVar12 = (long)(short)uVar2 & 0xffffffffU | (ulong)bVar1 << 0x20;
                  pRVar7 = (self->reduce_actions).contents;
                  uVar18 = (self->reduce_actions).size;
                  (self->reduce_actions).size = uVar18 + 1;
                  pRVar11 = pRVar7 + uVar18;
                  pRVar11->count = (int)uVar20;
                  pRVar11->symbol = (short)(uVar20 >> 0x20);
                  *(short *)&pRVar11->field_0x6 = (short)(uVar20 >> 0x30);
                  pRVar7 = pRVar7 + uVar18;
                  pRVar7->dynamic_precedence = (int)uVar12;
                  pRVar7->alias_sequence_id = (short)(uVar12 >> 0x20);
                  *(short *)&pRVar7->field_0xe = (short)(uVar12 >> 0x30);
                }
              }
              else if ((pTVar8[uVar19].field_0x6 & 0xf) == 0) goto LAB_00138dbb;
LAB_00138f07:
              bVar24 = bVar22;
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar21);
          }
          symbol = symbol + 1;
        } while (symbol != uVar14);
      }
      if ((self->reduce_actions).size == 0) {
        v1 = 0xffffffff;
      }
      else {
        lVar17 = 0xc;
        uVar21 = 0;
        do {
          pRVar11 = (self->reduce_actions).contents;
          v1 = ts_parser__reduce(self,version2,*(TSSymbol *)((long)pRVar11 + lVar17 + -8),
                                 *(uint32_t *)((long)pRVar11 + lVar17 + -0xc),
                                 *(int *)((long)pRVar11 + lVar17 + -4),
                                 *(uint16_t *)((long)&pRVar11->count + lVar17),true);
          uVar21 = uVar21 + 1;
          lVar17 = lVar17 + 0x10;
        } while (uVar21 < (self->reduce_actions).size);
      }
      _Var9 = true;
      if (!bVar24) {
        if (uVar16 < 6 && v1 != 0xffffffff) {
          ts_stack_renumber_version(self->stack,v1,version2);
          bVar24 = false;
          goto LAB_0013901b;
        }
        _Var9 = _Var13;
        if (lookahead_symbol != 0) {
          ts_stack_remove_version(self->stack,version2);
        }
      }
      _Var13 = _Var9;
      bVar24 = version2 == starting_version;
      version2 = version2 + 1;
      if (bVar24) {
        version2 = uVar5;
      }
      bVar24 = false;
    }
LAB_0013901b:
    if (bVar24) {
      return _Var13;
    }
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

static bool ts_parser__do_all_potential_reductions(TSParser *self,
                                                   StackVersion starting_version,
                                                   TSSymbol lookahead_symbol) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);

  bool can_shift_lookahead_symbol = false;
  StackVersion version = starting_version;
  for (unsigned i = 0; true; i++) {
    uint32_t version_count = ts_stack_version_count(self->stack);
    if (version >= version_count) break;

    bool merged = false;
    for (StackVersion i = initial_version_count; i < version; i++) {
      if (ts_stack_merge(self->stack, i, version)) {
        merged = true;
        break;
      }
    }
    if (merged) continue;

    TSStateId state = ts_stack_state(self->stack, version);
    bool has_shift_action = false;
    array_clear(&self->reduce_actions);

    TSSymbol first_symbol, end_symbol;
    if (lookahead_symbol != 0) {
      first_symbol = lookahead_symbol;
      end_symbol = lookahead_symbol + 1;
    } else {
      first_symbol = 1;
      end_symbol = self->language->token_count;
    }

    for (TSSymbol symbol = first_symbol; symbol < end_symbol; symbol++) {
      TableEntry entry;
      ts_language_table_entry(self->language, state, symbol, &entry);
      for (uint32_t i = 0; i < entry.action_count; i++) {
        TSParseAction action = entry.actions[i];
        switch (action.type) {
          case TSParseActionTypeShift:
          case TSParseActionTypeRecover:
            if (!action.params.extra && !action.params.repetition) has_shift_action = true;
            break;
          case TSParseActionTypeReduce:
            if (action.params.child_count > 0)
              ts_reduce_action_set_add(&self->reduce_actions, (ReduceAction){
                .symbol = action.params.symbol,
                .count = action.params.child_count,
                .dynamic_precedence = action.params.dynamic_precedence,
                .alias_sequence_id = action.params.alias_sequence_id,
              });
          default:
            break;
        }
      }
    }

    StackVersion reduction_version = STACK_VERSION_NONE;
    for (uint32_t i = 0; i < self->reduce_actions.size; i++) {
      ReduceAction action = self->reduce_actions.contents[i];

      reduction_version = ts_parser__reduce(
        self, version, action.symbol, action.count,
        action.dynamic_precedence, action.alias_sequence_id,
        true
      );
    }

    if (has_shift_action) {
      can_shift_lookahead_symbol = true;
    } else if (reduction_version != STACK_VERSION_NONE && i < MAX_VERSION_COUNT) {
      ts_stack_renumber_version(self->stack, reduction_version, version);
      continue;
    } else if (lookahead_symbol != 0) {
      ts_stack_remove_version(self->stack, version);
    }

    if (version == starting_version) {
      version = version_count;
    } else {
      version++;
    }
  }

  return can_shift_lookahead_symbol;
}